

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O3

bool __thiscall
ON_PostEffect::SetParameter(ON_PostEffect *this,wchar_t *param_name,ON_XMLVariant *param_value)

{
  bool bVar1;
  int iVar2;
  ON_XMLNode *pOVar3;
  undefined4 extraout_var;
  ON_XMLParameters p;
  ON_XMLVariant current_value;
  ON_XMLParameters OStack_118;
  ON_XMLVariant local_108;
  
  pOVar3 = CImpl::PepNode(this->_impl);
  if (pOVar3 != (ON_XMLNode *)0x0) {
    iVar2 = (*pOVar3->_vptr_ON_XMLNode[0x25])(pOVar3,L"state");
    if ((ON_XMLNode *)CONCAT44(extraout_var,iVar2) != (ON_XMLNode *)0x0) {
      ON_XMLParameters::ON_XMLParameters(&OStack_118,(ON_XMLNode *)CONCAT44(extraout_var,iVar2));
      ::ON_XMLVariant::ON_XMLVariant(&local_108);
      bVar1 = ON_XMLParameters::GetParam(&OStack_118,param_name,&local_108);
      if (bVar1) {
        pOVar3 = ON_XMLParameters::SetParam(&OStack_118,param_name,param_value);
        bVar1 = pOVar3 != (ON_XMLNode *)0x0;
      }
      else {
        bVar1 = false;
      }
      ::ON_XMLVariant::~ON_XMLVariant(&local_108);
      ON_XMLParameters::~ON_XMLParameters(&OStack_118);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ON_PostEffect::SetParameter(const wchar_t* param_name, const ON_XMLVariant& param_value)
{
  const ON_XMLNode* pep_node = _impl->PepNode();
  if (nullptr == pep_node)
    return false;

  ON_XMLNode* pep_param_node = pep_node->GetNamedChild(ON_RDK_PEP_PARAMS);
  if (nullptr == pep_param_node)
    return false;

  ON_XMLParameters p(*pep_param_node);

  ON_XMLVariant current_value;
  if (!p.GetParam(param_name, current_value))
    return false; // If you can't get it, you can't set it.

  if (!p.SetParam(param_name, param_value))
    return false;

  return true;
}